

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_semaphore_wrapper.hpp
# Opt level: O2

bool __thiscall
oqpi::posix_semaphore_wrapper::waitFor<long,std::ratio<1l,1l>>
          (posix_semaphore_wrapper *this,duration<long,_std::ratio<1L,_1L>_> *relTime)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  uint *puVar3;
  bool bVar4;
  timespec local_20;
  
  iVar1 = clock_gettime(0,&local_20);
  __stream = _stderr;
  if (iVar1 == -1) {
    puVar3 = (uint *)__errno_location();
    bVar4 = false;
    fprintf(__stream,"[error  ] clock_gettime failed with error code %d\n",(ulong)*puVar3);
  }
  else {
    local_20.tv_sec = local_20.tv_sec + relTime->__r;
    iVar1 = sem_timedwait((sem_t *)this->handle_,&local_20);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x6e) {
        fprintf(_stderr,"[error  ] sem_timedwait failed with error code %d\n");
      }
    }
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool waitFor(const std::chrono::duration<_Rep, _Period> &relTime)
        {
            timespec t;
            if (clock_gettime(CLOCK_REALTIME, &t) == -1)
            {
                oqpi_error("clock_gettime failed with error code %d", errno);
                return false;
            }

            auto nanoseconds    = std::chrono::duration_cast<std::chrono::nanoseconds>(relTime);
            const auto secs     = std::chrono::duration_cast<std::chrono::seconds>(nanoseconds);
            nanoseconds         -= secs;
            t.tv_sec            += secs.count();
            t.tv_nsec           += nanoseconds.count();

            const auto error    = sem_timedwait(handle_, &t);
            if(error == -1 && errno != ETIMEDOUT)
            {
                oqpi_error("sem_timedwait failed with error code %d", errno);
            }
            return error == 0;
        }